

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O3

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
jsoncons::jsonpointer::detail::
resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *current,
          string_view_type *buffer,bool create_if_missing,error_code *ec)

{
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  _Var1;
  bool bVar2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar3;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *pkVar4;
  value_type *pvVar5;
  uint uVar6;
  jsonpointer_errc __e;
  type tVar7;
  size_t index;
  pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
  local_48;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_30;
  
  pbVar3 = current;
  while( true ) {
    uVar6 = (byte)(pbVar3->field_0).json_ref_ & 0xf;
    if (1 < uVar6 - 8) break;
    pbVar3 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              ((long)&pbVar3->field_0 + 8);
  }
  if (uVar6 == 0xe) {
    if (((char *)buffer->_M_len == (char *)0x1) && (*(detail *)buffer->_M_str == (detail)0x2d)) {
      __e = index_exceeds_array_size;
    }
    else {
      local_48.first.it_._M_current =
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)0x0;
      tVar7 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        ((detail *)buffer->_M_str,(char *)buffer->_M_len,(size_t)&local_48,
                         (unsigned_long *)(ulong)uVar6);
      _Var1._M_current = local_48.first.it_._M_current;
      __e = invalid_index;
      if (tVar7.ec == success) {
        pkVar4 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                              (current);
        __e = index_exceeds_array_size;
        if (_Var1._M_current < pkVar4) {
          pvVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                             (current,(size_t)local_48.first.it_._M_current);
          return pvVar5;
        }
      }
    }
  }
  else {
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      (current);
    if (bVar2) {
      bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::contains
                        (current,buffer);
      if (bVar2) {
        pbVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (current,buffer);
        return pbVar3;
      }
      if (create_if_missing) {
        local_30.common_ = (common_storage)0x4;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        try_emplace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                  (&local_48,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   current,buffer,
                   (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   &local_30.common_);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   &local_30.common_);
        return &(local_48.first.it_._M_current)->value_;
      }
      __e = key_not_found;
    }
    else {
      __e = expected_object_or_array;
    }
  }
  std::error_code::operator=(ec,__e);
  return current;
}

Assistant:

Json* resolve(Json* current, const typename Json::string_view_type& buffer, bool create_if_missing, std::error_code& ec)
    {
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            std::size_t index{0};
            auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
            if (!result)
            {
                ec = jsonpointer_errc::invalid_index;
                return current;
            }
            if (index >= current->size())
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return current;
            }
            current = std::addressof(current->at(index));
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                if (create_if_missing)
                {
                    auto r = current->try_emplace(buffer, Json());
                    current = std::addressof(r.first->value());
                }
                else
                {
                    ec = jsonpointer_errc::key_not_found;
                    return current;
                }
            }
            else
            {
                current = std::addressof(current->at(buffer));
            }
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return current;
        }
        return current;
    }